

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void nowtech::log::
     Log<nowtech::log::QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>,_nowtech::log::SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>,_(signed_char)'\x02',_(nowtech::log::TaskRepresentation)2,_0UL,_444U>
     ::transmitterTaskFunction(void)

{
  bool bVar1;
  TaskId unaff_retaddr;
  TaskId taskId;
  tMessage message;
  undefined4 in_stack_ffffffffffffffe8;
  LogTime in_stack_ffffffffffffffec;
  undefined1 in_stack_fffffffffffffff0;
  byte bVar2;
  TaskId in_stack_fffffffffffffff2;
  undefined5 in_stack_fffffffffffffff3;
  tMessage *in_stack_fffffffffffffff8;
  
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffff8);
    bVar2 = 1;
    if (!bVar1) {
      bVar1 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
              ::empty();
      bVar2 = bVar1 ^ 0xff;
    }
    if ((bVar2 & 1) == 0) break;
    bVar1 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
            ::pop((MessageCompact<8UL,_true> *)
                  CONCAT53(in_stack_fffffffffffffff3,
                           CONCAT12(in_stack_fffffffffffffff2,
                                    CONCAT11(bVar2,in_stack_fffffffffffffff0))),
                  in_stack_ffffffffffffffec);
    if (bVar1) {
      in_stack_fffffffffffffff2 =
           MessageCompact<8UL,_true>::getTaskId
                     ((MessageCompact<8UL,_true> *)&stack0xfffffffffffffff3);
      bVar1 = MessageCompact<8UL,_true>::isShutdown
                        ((MessageCompact<8UL,_true> *)&stack0xfffffffffffffff3);
      if (bVar1) {
        std::array<std::atomic<bool>,_3UL>::operator[]
                  ((array<std::atomic<bool>,_3UL> *)
                   CONCAT53(in_stack_fffffffffffffff3,
                            CONCAT12(in_stack_fffffffffffffff2,
                                     CONCAT11(bVar2,in_stack_fffffffffffffff0))),
                   CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        std::atomic<bool>::operator=
                  ((atomic<bool> *)
                   CONCAT53(in_stack_fffffffffffffff3,
                            CONCAT12(in_stack_fffffffffffffff2,
                                     CONCAT11(bVar2,in_stack_fffffffffffffff0))),
                   SUB41(in_stack_ffffffffffffffec >> 0x18,0));
      }
      else {
        checkAndInsertAndTransmit(unaff_retaddr,in_stack_fffffffffffffff8);
      }
    }
  }
  AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::finish();
  return;
}

Assistant:

static void transmitterTaskFunction() noexcept {
    while(sKeepAliveTask || !tQueue::empty()) {
      tMessage message;
      if(tQueue::pop(message, tRefreshPeriod)) {
        TaskId taskId = message.getTaskId();
        if constexpr(csSendInBackground) {
          if (message.isShutdown()) {
            (*sTaskShutdowns)[taskId] = true;
          }
          else {
            checkAndInsertAndTransmit(taskId, message);
          }
        }
        else {
          checkAndInsertAndTransmit(taskId, message);
        }
      }
      else { // nothing to do
      }
    }
    tAppInterface::finish();
  }